

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

_Bool parse_vrplib_edge_weight_section(VrplibParser *p,Instance *instance)

{
  uint uVar1;
  _Bool _Var2;
  _Bool _Var3;
  ulong uVar4;
  char *lexeme;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  double value;
  ulong local_48;
  Instance *local_40;
  long local_38;
  
  if (p->edgew_format == EDGE_WEIGHT_FORMAT_EXPLICIT) {
    if (instance->edge_weight == (double *)0x0) {
      __assert_fail("instance->edge_weight",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
                    ,0x261,"_Bool parse_vrplib_edge_weight_section(VrplibParser *, Instance *)");
    }
    uVar1 = instance->num_customers;
    uVar4 = (ulong)uVar1;
    _Var3 = true;
    local_48 = uVar4;
    local_40 = instance;
    uVar8 = 0;
    while (uVar6 = uVar8, (int)uVar6 <= (int)uVar4) {
      uVar8 = uVar6 + 1;
      uVar9 = uVar8;
      while ((int)uVar9 <= (int)uVar4) {
        if (uVar6 == uVar9) {
          __assert_fail("i != j",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                        ,0x2c,"int64_t sxpos(int32_t, int32_t, int32_t)");
        }
        uVar7 = uVar9;
        if ((int)uVar6 < (int)uVar9) {
          uVar7 = uVar6;
        }
        uVar5 = uVar9;
        if ((int)uVar9 < (int)uVar6) {
          uVar5 = uVar6;
        }
        local_38 = (long)(int)((uVar7 * (uVar1 + 1) + uVar5) - ((uVar7 + 2) * (uVar7 + 1) >> 1)) <<
                   3;
        iVar10 = 3;
        while (iVar10 != 0) {
          lexeme = get_token_lexeme(p);
          if (iVar10 == 1) {
            value = 0.0;
            _Var2 = str_to_double(lexeme,&value);
            if (_Var2) {
              *(double *)((long)local_40->edge_weight + local_38) = value;
            }
            else {
              _Var3 = false;
              parse_error(p,"Expected valid double for reduced cost");
            }
          }
          else {
            uVar7 = uVar9;
            if (iVar10 == 3) {
              uVar7 = uVar6;
            }
            _Var3 = parse_node_id(p,lexeme,uVar7);
          }
          free(lexeme);
          iVar10 = iVar10 + -1;
          if (_Var3 == false) {
            return false;
          }
        }
        _Var2 = parser_match_newline(p);
        uVar9 = uVar9 + 1;
        uVar4 = local_48;
        if (!_Var2) {
          parse_error(p,"Expected newline after reduced cost for arc `(%d, %d)``",(ulong)uVar8,
                      (ulong)uVar9);
          return false;
        }
      }
    }
  }
  else {
    _Var3 = false;
    parse_error(p,
                "Found un-expected `EDGE_WEIGHT_SECTION`. EDGE_WEIGHT_TYPE should be set accordingly"
               );
  }
  return _Var3;
}

Assistant:

static bool parse_vrplib_edge_weight_section(VrplibParser *p,
                                             Instance *instance) {
    bool result = true;
    int32_t n = instance->num_customers + 1;

    bool needs_edge_section = parser_needs_edge_section(p);
    if (!needs_edge_section) {
        parse_error(p, "Found un-expected `EDGE_WEIGHT_SECTION`. "
                       "EDGE_WEIGHT_TYPE should be set accordingly");
        return false;
    }

    assert(instance->edge_weight);

    for (int32_t i = 0; i < n; i++) {
        for (int32_t j = i + 1; j < n; j++) {
            int32_t idx = sxpos(n, i, j);

            for (int32_t lexid = 0; lexid < 3; lexid++) {
                char *lexeme = get_token_lexeme(p);
                if (lexid == 0 || lexid == 1) {
                    result = parse_node_id(p, lexeme, lexid == 0 ? i : j);
                } else {
                    // Parse the reduced cost variable
                    double value = 0;
                    if (!str_to_double(lexeme, &value)) {
                        parse_error(p,
                                    "Expected valid double for reduced cost");
                        result = false;
                    } else {
                        instance->edge_weight[idx] = value;
                    }
                }

                if (lexeme) {
                    free(lexeme);
                }

                if (!result) {
                    goto terminate;
                }
            }

            if (!parser_match_newline(p)) {
                parse_error(p,
                            "Expected newline after reduced cost for arc "
                            "`(%d, %d)``",
                            i + 1, j + 1);
                result = false;
                goto terminate;
            }
        }
    }

terminate:
    return result;
}